

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O3

void __thiscall lsim::gui::CircuitEditor::refresh(CircuitEditor *this,UIContext *ui_context)

{
  ImVec2 local_18;
  
  local_18.x = 0.0;
  local_18.y = 0.0;
  ImGui::BeginChild("scrolling_region",&local_18,true,0x1c);
  init_ui_refresh(this);
  draw_ui(this,ui_context);
  user_interaction(this);
  ImGui::EndChild();
  return;
}

Assistant:

void CircuitEditor::refresh(UIContext *ui_context) {

	ImGui::BeginChild("scrolling_region", ImVec2(0, 0), true, ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollWithMouse);
	init_ui_refresh();
	draw_ui(ui_context);
	user_interaction();
	ImGui::EndChild();	// scrolling region
}